

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asio_service.cxx
# Opt level: O2

void __thiscall
nuraft::asio_rpc_client::asio_rpc_client
          (asio_rpc_client *this,asio_service_impl *_impl,io_service *io_svc,ssl_context *ssl_ctx,
          string *host,string *port,bool ssl_enabled,ptr<logger> l)

{
  ssl_socket *this_00;
  atomic<unsigned_long> *paVar1;
  __int_type_conflict _Var2;
  element_type *peVar3;
  int iVar4;
  string local_68;
  _Bind<bool_(nuraft::asio_rpc_client::*(nuraft::asio_rpc_client_*,_std::_Placeholder<1>,_std::_Placeholder<2>))(bool,_asio::ssl::verify_context_&)>
  local_48;
  
  (this->super_enable_shared_from_this<nuraft::asio_rpc_client>)._M_weak_this.
  super___weak_ptr<nuraft::asio_rpc_client,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0
  ;
  (this->super_enable_shared_from_this<nuraft::asio_rpc_client>)._M_weak_this.
  super___weak_ptr<nuraft::asio_rpc_client,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->super_rpc_client)._vptr_rpc_client = (_func_int **)&PTR__asio_rpc_client_00607e68;
  this->impl_ = _impl;
  asio::ip::basic_resolver<asio::ip::tcp,_asio::any_io_executor>::basic_resolver<asio::io_context>
            (&this->resolver_,io_svc,0);
  asio::basic_socket<asio::ip::tcp,_asio::any_io_executor>::basic_socket<asio::io_context>
            (&(this->socket_).super_basic_socket<asio::ip::tcp,_asio::any_io_executor>,io_svc,0);
  this_00 = &this->ssl_socket_;
  asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp,asio::any_io_executor>&>::
  stream<asio::basic_stream_socket<asio::ip::tcp,asio::any_io_executor>&>
            ((stream<asio::basic_stream_socket<asio::ip::tcp,asio::any_io_executor>&> *)this_00,
             &this->socket_,ssl_ctx);
  (this->attempting_conn_)._M_base._M_i = false;
  std::__cxx11::string::string((string *)&this->host_,(string *)host);
  std::__cxx11::string::string((string *)&this->port_,(string *)port);
  this->ssl_enabled_ = ssl_enabled;
  (this->ssl_ready_)._M_base._M_i = false;
  (this->num_send_fails_).super___atomic_base<unsigned_long>._M_i = 0;
  this->abandoned_ = (__atomic_base<bool>)0x0;
  this->socket_busy_ = (__atomic_base<bool>)0x0;
  asio::
  basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::any_io_executor>
  ::basic_waitable_timer<asio::io_context>(&this->operation_timer_,io_svc,0);
  std::__shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&(this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>,
             (__shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2> *)
             l.super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  LOCK();
  paVar1 = &this->impl_->client_id_counter_;
  _Var2 = (paVar1->super___atomic_base<unsigned_long>)._M_i;
  (paVar1->super___atomic_base<unsigned_long>)._M_i =
       (paVar1->super___atomic_base<unsigned_long>)._M_i + 1;
  UNLOCK();
  this->client_id_ = _Var2;
  if (this->ssl_enabled_ == true) {
    asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>_&>::
    set_verify_mode(this_00,(_impl->my_opt_).skip_verification_ ^ 1);
    local_48._M_f = (offset_in_asio_rpc_client_to_subr)verify_certificate;
    local_48._8_8_ = 0;
    local_48._M_bound_args.
    super__Tuple_impl<0UL,_nuraft::asio_rpc_client_*,_std::_Placeholder<1>,_std::_Placeholder<2>_>.
    super__Head_base<0UL,_nuraft::asio_rpc_client_*,_false>._M_head_impl =
         (_Tuple_impl<0UL,_nuraft::asio_rpc_client_*,_std::_Placeholder<1>,_std::_Placeholder<2>_>)
         (_Tuple_impl<0UL,_nuraft::asio_rpc_client_*,_std::_Placeholder<1>,_std::_Placeholder<2>_>)
         this;
    asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp,asio::any_io_executor>&>::
    set_verify_callback<std::_Bind<bool(nuraft::asio_rpc_client::*(nuraft::asio_rpc_client*,std::_Placeholder<1>,std::_Placeholder<2>))(bool,asio::ssl::verify_context&)>>
              ((stream<asio::basic_stream_socket<asio::ip::tcp,asio::any_io_executor>&> *)this_00,
               &local_48);
  }
  peVar3 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (peVar3 != (element_type *)0x0) {
    iVar4 = (*peVar3->_vptr_logger[7])();
    if (5 < iVar4) {
      peVar3 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      msg_if_given_abi_cxx11_(&local_68,"asio client created: %p",this);
      (*peVar3->_vptr_logger[8])
                (peVar3,6,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/asio_service.cxx"
                 ,"asio_rpc_client",0x39f,&local_68);
      std::__cxx11::string::~string((string *)&local_68);
    }
  }
  return;
}

Assistant:

asio_rpc_client(asio_service_impl* _impl,
                    asio::io_service& io_svc,
                    ssl_context& ssl_ctx,
                    std::string& host,
                    std::string& port,
                    bool ssl_enabled,
                    ptr<logger> l)
        : impl_(_impl)
        , resolver_(io_svc)
        , socket_(io_svc)
        , ssl_socket_(socket_, ssl_ctx)
        , attempting_conn_(false)
        , host_(host)
        , port_(port)
        , ssl_enabled_(ssl_enabled)
        , ssl_ready_(false)
        , num_send_fails_(0)
        , abandoned_(false)
        , socket_busy_(false)
        , operation_timer_(io_svc)
        , l_(l)
    {
        client_id_ = impl_->assign_client_id();
        if (ssl_enabled_) {
#ifdef SSL_LIBRARY_NOT_FOUND
            assert(0); // Should not reach here.
#else
            if (_impl->get_options().skip_verification_) {
                ssl_socket_.set_verify_mode(asio::ssl::verify_none);
            } else {
                ssl_socket_.set_verify_mode(asio::ssl::verify_peer);
            }

            ssl_socket_.set_verify_callback
                        ( std::bind( &asio_rpc_client::verify_certificate,
                                     this,
                                     std::placeholders::_1,
                                     std::placeholders::_2 ) );
#endif
        }
        p_tr("asio client created: %p", this);
    }